

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

void __thiscall
testing::internal::
ComparisonBase<testing::internal::EqMatcher<prometheus::ClientMetric::Label>,_prometheus::ClientMetric::Label,_testing::internal::AnyEq>
::~ComparisonBase(ComparisonBase<testing::internal::EqMatcher<prometheus::ClientMetric::Label>,_prometheus::ClientMetric::Label,_testing::internal::AnyEq>
                  *this)

{
  ComparisonBase<testing::internal::EqMatcher<prometheus::ClientMetric::Label>,_prometheus::ClientMetric::Label,_testing::internal::AnyEq>
  *this_local;
  
  prometheus::ClientMetric::Label::~Label(&this->rhs_);
  return;
}

Assistant:

explicit ComparisonBase(const Rhs& rhs) : rhs_(rhs) {}